

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

CVmGramProdState *
CVmObjGramProd::enqueue_new_state
          (CVmGramProdMem *mem,size_t start_tok_pos,CVmGramProdState *enclosing_state,
          vmgram_alt_info *altp,vm_obj_id_t self,int *need_to_clone,CVmGramProdQueue *queues,
          int circular_alt)

{
  CVmGramProdState *pCVar1;
  bool bVar2;
  
  pCVar1 = create_new_state(mem,start_tok_pos,enclosing_state,altp,self,need_to_clone,circular_alt);
  bVar2 = altp->badness != 0;
  pCVar1->nxt_ = (&queues->work_queue_)[bVar2];
  (&queues->work_queue_)[bVar2] = pCVar1;
  return pCVar1;
}

Assistant:

CVmGramProdState *CVmObjGramProd::
   enqueue_new_state(CVmGramProdMem *mem,
                     size_t start_tok_pos,
                     CVmGramProdState *enclosing_state,
                     const vmgram_alt_info *altp, vm_obj_id_t self,
                     int *need_to_clone, CVmGramProdQueue *queues,
                     int circular_alt)
{
    CVmGramProdState *state;

    /* create the new state */
    state = create_new_state(mem, start_tok_pos, enclosing_state,
                             altp, self, need_to_clone, circular_alt);
    
    /* 
     *   Add the item to the appropriate queue.  If the item has an
     *   associated badness, add it to the badness queue.  Otherwise, add
     *   it to the work queue.  
     */
    if (altp->badness != 0)
    {
        /* 
         *   we have a badness rating - add it to the badness queue, since
         *   we don't want to process it until we entirely exhaust better
         *   possibilities 
         */
        state->nxt_ = queues->badness_queue_;
        queues->badness_queue_ = state;
    }
    else
    {
        /* enqueue the state */
        enqueue_state(state, queues);
    }

    /* return the new state */
    return state;
}